

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PyCode.cc
# Opt level: O1

int __thiscall PyCode::generateMainPy(PyCode *this,string *cwd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  string path;
  ofstream ofs;
  long *local_280;
  long local_270;
  long lStack_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220);
  pcVar2 = (cwd->_M_dataplus)._M_p;
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,pcVar2,pcVar2 + cwd->_M_string_length);
  std::__cxx11::string::append((char *)local_240);
  std::ofstream::open((string *)&local_220,(_Ios_Openmode)local_240);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"from prettytable import PrettyTable\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"from MFStruct import operateClass\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"from postgresCon import postgresCon\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,"def main():\n",0xc);
    std::operator+(&local_260,"\tselectAttr = \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_260);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_270 = *plVar7;
      lStack_268 = plVar5[3];
      local_280 = &local_270;
    }
    else {
      local_270 = *plVar7;
      local_280 = (long *)*plVar5;
    }
    lVar3 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,(char *)local_280,lVar3);
    if (local_280 != &local_270) {
      operator_delete(local_280);
    }
    paVar1 = &local_260.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p);
    }
    std::operator+(&local_260,"\thavingCond = \"",&(this->mfStruct).havingCond);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_260);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_270 = *plVar7;
      lStack_268 = plVar5[3];
      local_280 = &local_270;
    }
    else {
      local_270 = *plVar7;
      local_280 = (long *)*plVar5;
    }
    lVar3 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,(char *)local_280,lVar3);
    if (local_280 != &local_270) {
      operator_delete(local_280);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p);
    }
    std::operator+(&local_260,"\tgroup_attr = \",\".join([\"",&(this->mfStruct).groupAttr);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_260);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_270 = *plVar7;
      lStack_268 = plVar5[3];
      local_280 = &local_270;
    }
    else {
      local_270 = *plVar7;
      local_280 = (long *)*plVar5;
    }
    lVar3 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,(char *)local_280,lVar3);
    if (local_280 != &local_270) {
      operator_delete(local_280);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p);
    }
    std::operator+(&local_260,"\tagg_func = dict(",&(this->mfStruct).aggFunc);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_260);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_270 = *plVar7;
      lStack_268 = plVar5[3];
      local_280 = &local_270;
    }
    else {
      local_270 = *plVar7;
      local_280 = (long *)*plVar5;
    }
    lVar3 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,(char *)local_280,lVar3);
    if (local_280 != &local_270) {
      operator_delete(local_280);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p);
    }
    std::operator+(&local_260,"\tselect_cond = dict(",&(this->mfStruct).selectCondVect);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_260);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_270 = *plVar7;
      lStack_268 = plVar5[3];
      local_280 = &local_270;
    }
    else {
      local_270 = *plVar7;
      local_280 = (long *)*plVar5;
    }
    lVar3 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,(char *)local_280,lVar3);
    if (local_280 != &local_270) {
      operator_delete(local_280);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\tfor key in agg_func:\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\t\tagg_func[key] = agg_func[key].split(\", \")\n",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,"\tsize = 3\n",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,
               "\tmf_struct = operateClass(selectAttr, havingCond, size, group_attr, agg_func, select_cond)\n"
               ,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\tmf_struct.parse_agg_group()\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\tmf_struct.parse_select_attr()\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\tusrname = input(\"Input username for connecting DB: \")\n",
               0x37);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\tpwd = input(\"Input pwd for connecting DB\")\n",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\thost = input(\"Input DB address: \")\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\tconn = postgresCon(usrname, pwd, host, mf_struct)\n",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\tconn.get_group_attr_data()\n",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\tconn.main_algo()\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\tconn.closeDB()\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\toutput = conn.project_data()\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\tprint(output)\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,"\n\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"if __name__ == \"__main__\":\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,"\tmain()\n",8);
    if (local_240[0] != local_230) {
      operator_delete(local_240[0]);
    }
    local_220 = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_218);
    std::ios_base::~ios_base(local_128);
    return 0;
  }
  std::ios::clear((int)(string *)&local_220 + (int)*(undefined8 *)(local_220 + -0x18));
  std::ofstream::close();
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = &PTR__exception_00116d80;
  __cxa_throw(puVar6,&ParserClassException::FileNotOpenException::typeinfo,
              std::exception::~exception);
}

Assistant:

int PyCode::generateMainPy(std::string cwd) throw()
{
    std::ofstream ofs;
    std::string path = cwd + "/main.py";
    ofs.open(path, std::ios::out);
    if (!ofs.is_open())
    {
        ofs.clear();
        ofs.close();
        throw ParserClassException::FileNotOpenException();
    }
    else
    {
        ofs << "from prettytable import PrettyTable\n";
        ofs << "from MFStruct import operateClass\n";
        ofs << "from postgresCon import postgresCon\n";
        ofs << "\n";
        ofs << "def main():\n";
        ofs << "\tselectAttr = \"" + this->mfStruct.selectAttr + "\"\n";
        ofs << "\thavingCond = \"" + this->mfStruct.havingCond + "\"\n";
        ofs << "\tgroup_attr = \",\".join([\"" + this->mfStruct.groupAttr + "\"])\n";
        ofs << "\tagg_func = dict(" + this->mfStruct.aggFunc + ")\n";
        ofs << "\tselect_cond = dict(" + this->mfStruct.selectCondVect + ")\n";
        ofs << "\tfor key in agg_func:\n";
        ofs << "\t\tagg_func[key] = agg_func[key].split(\", \")\n";
        ofs << "\tsize = 3\n";
        ofs << "\tmf_struct = operateClass(selectAttr, havingCond, size, group_attr, agg_func, select_cond)\n";
        ofs << "\tmf_struct.parse_agg_group()\n";
        ofs << "\tmf_struct.parse_select_attr()\n";
        ofs << "\n";
        ofs << "\tusrname = input(\"Input username for connecting DB: \")\n";
        ofs << "\tpwd = input(\"Input pwd for connecting DB\")\n";
        ofs << "\thost = input(\"Input DB address: \")\n";
        ofs << "\tconn = postgresCon(usrname, pwd, host, mf_struct)\n";
        ofs << "\tconn.get_group_attr_data()\n";
        ofs << "\tconn.main_algo()\n";
        ofs << "\tconn.closeDB()\n";
        ofs << "\toutput = conn.project_data()\n";
        ofs << "\tprint(output)\n";
        ofs << "\n\n";
        ofs << "if __name__ == \"__main__\":\n";
        ofs << "\tmain()\n";
    }
    return 0;
}